

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime_interface.cpp
# Opt level: O0

XrResult __thiscall
RuntimeInterface::CreateInstance
          (RuntimeInterface *this,XrInstanceCreateInfo *info,XrInstance *instance)

{
  XrResult XVar1;
  pointer pXVar2;
  mapped_type *this_00;
  PFN_xrVoidFunction local_58;
  PFN_xrDestroyInstance rt_xrDestroyInstance;
  lock_guard<std::mutex> mlock;
  unique_ptr<XrGeneratedDispatchTableCore,_std::default_delete<XrGeneratedDispatchTableCore>_>
  local_38;
  unique_ptr<XrGeneratedDispatchTableCore,_std::default_delete<XrGeneratedDispatchTableCore>_>
  dispatch_table;
  PFN_xrCreateInstance rt_xrCreateInstance;
  bool create_succeeded;
  XrResult res;
  XrInstance *instance_local;
  XrInstanceCreateInfo *info_local;
  RuntimeInterface *this_local;
  
  (*this->_get_instance_proc_addr)
            ((XrInstance)0x0,"xrCreateInstance",(PFN_xrVoidFunction *)&dispatch_table);
  XVar1 = (*(code *)dispatch_table._M_t.
                    super___uniq_ptr_impl<XrGeneratedDispatchTableCore,_std::default_delete<XrGeneratedDispatchTableCore>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_XrGeneratedDispatchTableCore_*,_std::default_delete<XrGeneratedDispatchTableCore>_>
                    .super__Head_base<0UL,_XrGeneratedDispatchTableCore_*,_false>._M_head_impl)
                    (info);
  if (XR_ERROR_VALIDATION_FAILURE < XVar1) {
    pXVar2 = (pointer)operator_new(0x1f8);
    memset(pXVar2,0,0x1f8);
    std::unique_ptr<XrGeneratedDispatchTableCore,std::default_delete<XrGeneratedDispatchTableCore>>
    ::unique_ptr<std::default_delete<XrGeneratedDispatchTableCore>,void>
              ((unique_ptr<XrGeneratedDispatchTableCore,std::default_delete<XrGeneratedDispatchTableCore>>
                *)&local_38,pXVar2);
    pXVar2 = std::
             unique_ptr<XrGeneratedDispatchTableCore,_std::default_delete<XrGeneratedDispatchTableCore>_>
             ::get(&local_38);
    GeneratedXrPopulateDispatchTableCore(pXVar2,*instance,this->_get_instance_proc_addr);
    std::lock_guard<std::mutex>::lock_guard
              ((lock_guard<std::mutex> *)&rt_xrDestroyInstance,&this->_dispatch_table_mutex);
    this_00 = std::
              unordered_map<XrInstance_T_*,_std::unique_ptr<XrGeneratedDispatchTableCore,_std::default_delete<XrGeneratedDispatchTableCore>_>,_std::hash<XrInstance_T_*>,_std::equal_to<XrInstance_T_*>,_std::allocator<std::pair<XrInstance_T_*const,_std::unique_ptr<XrGeneratedDispatchTableCore,_std::default_delete<XrGeneratedDispatchTableCore>_>_>_>_>
              ::operator[](&this->_dispatch_table_map,instance);
    std::
    unique_ptr<XrGeneratedDispatchTableCore,_std::default_delete<XrGeneratedDispatchTableCore>_>::
    operator=(this_00,&local_38);
    std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&rt_xrDestroyInstance);
    std::
    unique_ptr<XrGeneratedDispatchTableCore,_std::default_delete<XrGeneratedDispatchTableCore>_>::
    ~unique_ptr(&local_38);
  }
  if ((XVar1 < XR_SUCCESS) && (XR_ERROR_VALIDATION_FAILURE < XVar1)) {
    (*this->_get_instance_proc_addr)(*instance,"xrDestroyInstance",&local_58);
    (*local_58)(*instance);
    *instance = (XrInstance)0x0;
  }
  return XVar1;
}

Assistant:

XrResult RuntimeInterface::CreateInstance(const XrInstanceCreateInfo* info, XrInstance* instance) {
    XrResult res = XR_SUCCESS;
    bool create_succeeded = false;
    PFN_xrCreateInstance rt_xrCreateInstance;
    _get_instance_proc_addr(XR_NULL_HANDLE, "xrCreateInstance", reinterpret_cast<PFN_xrVoidFunction*>(&rt_xrCreateInstance));
    res = rt_xrCreateInstance(info, instance);
    if (XR_SUCCEEDED(res)) {
        create_succeeded = true;
        std::unique_ptr<XrGeneratedDispatchTableCore> dispatch_table(new XrGeneratedDispatchTableCore());
        GeneratedXrPopulateDispatchTableCore(dispatch_table.get(), *instance, _get_instance_proc_addr);
        std::lock_guard<std::mutex> mlock(_dispatch_table_mutex);
        _dispatch_table_map[*instance] = std::move(dispatch_table);
    }

    // If the failure occurred during the populate, clean up the instance we had picked up from the runtime
    if (XR_FAILED(res) && create_succeeded) {
        PFN_xrDestroyInstance rt_xrDestroyInstance;
        _get_instance_proc_addr(*instance, "xrDestroyInstance", reinterpret_cast<PFN_xrVoidFunction*>(&rt_xrDestroyInstance));
        rt_xrDestroyInstance(*instance);
        *instance = XR_NULL_HANDLE;
    }

    return res;
}